

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

Var __thiscall
Js::SourceTextModuleRecord::PostProcessDynamicModuleImport(SourceTextModuleRecord *this)

{
  Type *addr;
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  Data DVar6;
  int iVar7;
  BOOL BVar8;
  Var in_RAX;
  undefined4 *puVar9;
  undefined7 extraout_var;
  JavascriptPromise *pJVar10;
  Var extraout_RAX;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16_t *pcVar11;
  Var extraout_RAX_00;
  Var extraout_RAX_01;
  JavascriptString *pJVar12;
  undefined4 extraout_var_03;
  size_t sVar13;
  Recycler *this_00;
  JavascriptError *pError;
  Var pvVar14;
  void *__frameAddr;
  PCWSTR message;
  long lVar15;
  undefined1 local_90 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  undefined4 extraout_var_02;
  
  scriptContext = (this->scriptContext).ptr;
  pJVar10 = (this->promise).ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x12f,"(scriptContext != nullptr)","scriptContext != nullptr");
    in_RAX = (Var)CONCAT71(extraout_var,bVar4);
    if (!bVar4) goto LAB_00b12b84;
    *puVar9 = 0;
  }
  addr = &this->promise;
  if (pJVar10 == (JavascriptPromise *)0x0) {
    pJVar10 = JavascriptPromise::CreateEnginePromise(scriptContext);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pJVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    in_RAX = extraout_RAX;
  }
  if (this->parentsNotified == true) {
    iVar5 = 0;
    if (this->wasDeclarationInitialized == false) {
      iVar5 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])(this);
      in_RAX = (Var)CONCAT44(extraout_var_00,iVar5);
      if ((char)iVar5 != '\0') {
        iVar5 = (*(this->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0xb])(this);
        in_RAX = (Var)CONCAT44(extraout_var_01,iVar5);
      }
      if ((this->errorObject).ptr == (void *)0x0) {
        iVar5 = 0;
        if ((this->hadNotifyHostReady == false) &&
           ((this->super_ModuleRecordBase).wasEvaluated == false)) {
          pvVar14 = (this->normalizedSpecifier).ptr;
          if (pvVar14 == (Var)0x0) {
            pcVar11 = L"module";
          }
          else {
            pJVar12 = VarTo<Js::JavascriptString>(pvVar14);
            iVar5 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
            pcVar11 = (char16_t *)CONCAT44(extraout_var_02,iVar5);
          }
          Output::TraceWithFlush
                    (ModulePhase,
                     L"\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n",pcVar11)
          ;
          if (scriptContext->threadContext->isScriptActive == true) {
            LeaveScriptObject<true,_true,_false>::LeaveScriptObject
                      ((LeaveScriptObject<true,_true,_false> *)local_90,scriptContext,
                       &stack0xfffffffffffffff8);
            pTVar1 = scriptContext->threadContext;
            bVar4 = pTVar1->reentrancySafeOrHandled;
            pTVar1->reentrancySafeOrHandled = true;
            iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                              (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
            ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
            pTVar1->reentrancySafeOrHandled = bVar4;
            LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
                      ((LeaveScriptObject<true,_true,_false> *)local_90);
            in_RAX = extraout_RAX_00;
          }
          else {
            DVar6 = ExceptionCheck::Save();
            local_90._0_4_ = DVar6.handledExceptionType;
            iVar5 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                              (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
            ExceptionCheck::Restore((Data *)local_90);
            in_RAX = extraout_RAX_01;
          }
          this->hadNotifyHostReady = true;
        }
      }
      else {
        ReleaseParserResourcesForHierarchy(this);
        in_RAX = ResolveOrRejectDynamicImportPromise
                           (false,(this->errorObject).ptr,scriptContext,this,false);
        iVar5 = 0;
      }
    }
    if (iVar5 < 0) {
      ReleaseParserResourcesForHierarchy(this);
      pvVar14 = (this->normalizedSpecifier).ptr;
      if (pvVar14 == (Var)0x0) {
        pcVar11 = L"module";
      }
      else {
        pJVar12 = VarTo<Js::JavascriptString>(pvVar14);
        iVar7 = (*(pJVar12->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(pJVar12);
        pcVar11 = (char16_t *)CONCAT44(extraout_var_03,iVar7);
      }
      sVar13 = PAL_wcslen(pcVar11);
      __leaveScriptObject.frameAddress = (void *)(sVar13 + 1);
      local_90 = (undefined1  [8])&char16_t::typeinfo;
      __leaveScriptObject.scriptContext = (ScriptContext *)0x0;
      __leaveScriptObject._16_8_ = anon_var_dwarf_59ecae4;
      __leaveScriptObject.savedFPUControl.m_oldFpuControl = 0x15d;
      this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_90)
      ;
      lVar15 = sVar13 + 1;
      __leaveScriptObject._32_8_ = sVar13;
      if (lVar15 == 0) {
        Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
        message = (PCWSTR)&DAT_00000008;
      }
      else {
        sVar13 = 0xffffffffffffffff;
        if (-1 < lVar15) {
          sVar13 = lVar15 * 2;
        }
        BVar8 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar8 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar4) goto LAB_00b12b84;
          *puVar9 = 0;
        }
        if (sVar13 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                      "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
          if (!bVar4) goto LAB_00b12b84;
          *puVar9 = 0;
        }
        message = (PCWSTR)Memory::Recycler::
                          AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                    (this_00,sVar13);
        if (message == (PCWSTR)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar4) {
LAB_00b12b84:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar9 = 0;
        }
      }
      uVar3 = __leaveScriptObject._32_8_;
      memcpy_s(message,lVar15 * 2,pcVar11,__leaveScriptObject._32_8_ * 2);
      message[uVar3] = L'\0';
      pError = JavascriptLibrary::CreateURIError
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      JavascriptError::SetErrorMessageProperties(pError,iVar5,message,scriptContext);
      in_RAX = ResolveOrRejectDynamicImportPromise(false,pError,scriptContext,this,true);
    }
    if (iVar5 < 0) {
      return in_RAX;
    }
  }
  pvVar14 = JavascriptPromise::CreatePassThroughPromise(addr->ptr,scriptContext);
  return pvVar14;
}

Assistant:

Var SourceTextModuleRecord::PostProcessDynamicModuleImport()
    {
        JavascriptPromise *promise = this->GetPromise();
        ScriptContext* scriptContext = GetScriptContext();
        AnalysisAssert(scriptContext != nullptr);
        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
            this->SetPromise(promise);
        }

        if (this->ParentsNotified())
        {
            HRESULT hr = NOERROR;
            if (!WasDeclarationInitialized())
            {
                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, scriptContext, this, false);
                }
                else
                {
                    if (!hadNotifyHostReady && !WasEvaluated())
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n"), this->GetSpecifierSz());
                        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                        {
                            hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                        });

                        hadNotifyHostReady = true;
                    }
                }
            }

            if (FAILED(hr))
            {
                // Cleanup in case of error.
                this->ReleaseParserResourcesForHierarchy();

                // We cannot just use the buffer in the specifier string - need to make a copy here.
                const char16* moduleName = this->GetSpecifierSz();
                size_t length = wcslen(moduleName);
                char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
                wmemcpy_s(allocatedString, length + 1, moduleName, length);
                allocatedString[length] = _u('\0');

                Js::JavascriptError * error = scriptContext->GetLibrary()->CreateURIError();
                JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext, this);
            }
        }

        return JavascriptPromise::CreatePassThroughPromise(this->promise, scriptContext);
    }